

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsVarDeserializerFree(JsVarDeserializerHandle deserializerHandle)

{
  JsVarDeserializerHandle local_18;
  JsVarDeserializerHandle deserializerHandle_local;
  
  if (deserializerHandle == (JsVarDeserializerHandle)0x0) {
    deserializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    local_18 = deserializerHandle;
    deserializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarDeserializerFree::__0>
                   ((anon_class_8_1_ac85ff99)&local_18,false,false);
  }
  return deserializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarDeserializerFree(_In_ JsVarDeserializerHandle deserializerHandle)
{
    PARAM_NOT_NULL(deserializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        deserializer->FreeSelf();
        return JsNoError;
    });
}